

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::addRows(Highs *this,HighsInt num_new_row,double *lower_bounds,double *upper_bounds,
              HighsInt num_new_nz,HighsInt *starts,HighsInt *indices,double *values)

{
  HighsStatus HVar1;
  HighsStatus return_status;
  HighsInt *in_stack_000003c0;
  HighsInt in_stack_000003cc;
  double *in_stack_000003d0;
  double *in_stack_000003d8;
  HighsInt in_stack_000003e4;
  Highs *in_stack_000003e8;
  HighsInt *in_stack_00000400;
  double *in_stack_00000408;
  HighsLogOptions *in_stack_fffffffffffffef8;
  Highs *in_stack_ffffffffffffff00;
  allocator local_d1;
  string local_d0 [16];
  string *in_stack_ffffffffffffff40;
  HighsStatus in_stack_ffffffffffffff48;
  HighsStatus in_stack_ffffffffffffff4c;
  Highs *in_stack_ffffffffffffff50;
  HighsStatus local_4;
  
  logHeader(in_stack_ffffffffffffff00);
  clearDerivedModelProperties(in_stack_ffffffffffffff00);
  HighsLogOptions::HighsLogOptions
            ((HighsLogOptions *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  addRowsInterface(in_stack_000003e8,in_stack_000003e4,in_stack_000003d8,in_stack_000003d0,
                   in_stack_000003cc,in_stack_000003c0,in_stack_00000400,in_stack_00000408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"addRows",&local_d1);
  HVar1 = interpretCallStatus((HighsLogOptions *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c
                              ,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x49259c);
  if (HVar1 == kError) {
    local_4 = kError;
  }
  else {
    local_4 = returnFromHighs(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  }
  return local_4;
}

Assistant:

HighsStatus Highs::addRows(const HighsInt num_new_row,
                           const double* lower_bounds,
                           const double* upper_bounds,
                           const HighsInt num_new_nz, const HighsInt* starts,
                           const HighsInt* indices, const double* values) {
  this->logHeader();
  HighsStatus return_status = HighsStatus::kOk;
  clearDerivedModelProperties();
  return_status = interpretCallStatus(
      options_.log_options,
      addRowsInterface(num_new_row, lower_bounds, upper_bounds, num_new_nz,
                       starts, indices, values),
      return_status, "addRows");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}